

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::TimerContainer::GetIndexLeftInterval(TimerContainer *this,uint16_t index)

{
  uint32_t uVar1;
  iterator iVar2;
  key_type_conflict local_4;
  
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_timer_wheel)._M_h,&local_4);
  uVar1 = 0;
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (uVar1 = 0,
     *(long *)((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                     ._M_cur + 0x38) != 0)) {
    uVar1 = *(uint32_t *)
             (*(long *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_false>
                              ._M_cur + 0x28) + 0x20);
  }
  return uVar1;
}

Assistant:

uint32_t TimerContainer::GetIndexLeftInterval(uint16_t index) {
    uint32_t left_interval = 0;
    auto timer_map = _timer_wheel.find(index);
    if (timer_map != _timer_wheel.end() && !timer_map->second.empty()) {
        left_interval = timer_map->second.begin()->first;
    }
    return left_interval;
}